

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool __thiscall wasm::WATParser::anon_unknown_0::LexIntCtx::takeDigit(LexIntCtx *this)

{
  uint64_t uVar1;
  bool bVar2;
  uint8_t c;
  int *piVar3;
  ulong uVar4;
  uint64_t newN;
  optional<int> d;
  LexIntCtx *this_local;
  
  d.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)this;
  bVar2 = LexCtx::empty(&this->super_LexCtx);
  if (!bVar2) {
    c = LexCtx::peek(&this->super_LexCtx);
    newN = (uint64_t)getDigit(c);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&newN);
    if (bVar2) {
      LexCtx::take(&this->super_LexCtx,1);
      uVar1 = this->n;
      piVar3 = std::optional<int>::operator*((optional<int> *)&newN);
      uVar4 = uVar1 * 10 + (long)*piVar3;
      if (uVar4 < this->n) {
        this->overflow = true;
      }
      this->n = uVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool takeDigit() {
    if (!empty()) {
      if (auto d = getDigit(peek())) {
        take(1);
        uint64_t newN = n * 10 + *d;
        if (newN < n) {
          overflow = true;
        }
        n = newN;
        return true;
      }
    }
    return false;
  }